

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  byte bVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  char *pcVar5;
  char *pcVar6;
  Boolean BVar7;
  ostream *poVar8;
  uchar **r;
  uchar **g;
  uchar **b;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  GSFloodFill<unsigned_char> *pGVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar20;
  int iVar21;
  undefined1 auVar19 [16];
  int iVar22;
  long lVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  string iFileName;
  string oFileName;
  string dFileName;
  string XSDPath;
  Mat src;
  Mat dst;
  Mat diff;
  int local_280;
  long *local_270;
  Mat *local_268;
  long local_260 [10];
  char *local_210;
  char *local_208;
  char local_200;
  undefined7 uStack_1ff;
  long local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  undefined1 *local_1c8;
  char *local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined1 *local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  undefined1 local_188 [16];
  long local_178;
  _InputArray local_168;
  _OutputArray local_150 [4];
  _OutputArray local_f0 [4];
  Mat local_90 [96];
  
  local_210 = &local_200;
  local_208 = (char *)0x0;
  local_200 = '\0';
  local_1e8 = &local_1d8;
  local_1e0 = (char *)0x0;
  local_1d8 = 0;
  local_1c8 = &local_1b8;
  local_1c0 = (char *)0x0;
  local_1b8 = 0;
  cv::Mat::Mat((Mat *)local_150);
  cv::Mat::Mat((Mat *)local_f0);
  cv::Mat::Mat(local_90);
  local_1a8 = &local_198;
  local_1a0 = (char *)0x0;
  local_280 = 0;
  local_198 = 0;
  if (1 < argc) {
    local_280 = 0;
    iVar16 = 1;
    do {
      pcVar6 = local_1a0;
      pcVar5 = local_1c0;
      pcVar3 = local_1e0;
      pcVar13 = local_208;
      if (*argv[iVar16] == '-') {
        bVar2 = argv[iVar16][1];
        if (bVar2 < 0x6f) {
          if (bVar2 == 100) {
            pcVar13 = argv[(long)iVar16 + 1];
            strlen(pcVar13);
            std::__cxx11::string::_M_replace((ulong)&local_1c8,0,pcVar5,(ulong)pcVar13);
          }
          else {
            if (bVar2 != 0x69) {
              if (bVar2 == 0x68) {
                iVar16 = 0;
                printHelp();
              }
              else {
LAB_00106a8e:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unknown switch.\n",0x10);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
                std::ostream::put(-0x80);
                std::ostream::flush();
                iVar16 = -1;
                printHelp();
              }
              goto LAB_001069b1;
            }
            pcVar3 = argv[(long)iVar16 + 1];
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)&local_210,0,pcVar13,(ulong)pcVar3);
          }
        }
        else if (bVar2 == 0x6f) {
          pcVar13 = argv[(long)iVar16 + 1];
          strlen(pcVar13);
          std::__cxx11::string::_M_replace((ulong)&local_1e8,0,pcVar3,(ulong)pcVar13);
        }
        else {
          if (bVar2 == 0x76) {
            local_280 = 1;
            goto LAB_00106292;
          }
          if (bVar2 != 0x78) goto LAB_00106a8e;
          pcVar13 = argv[(long)iVar16 + 1];
          strlen(pcVar13);
          std::__cxx11::string::_M_replace((ulong)&local_1a8,0,pcVar6,(ulong)pcVar13);
        }
        iVar16 = iVar16 + 1;
      }
LAB_00106292:
      iVar16 = iVar16 + 1;
    } while (iVar16 < argc);
  }
  if (local_208 == (char *)0x0) {
    iVar16 = -1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Option -i <filename> must be present! Aborting...\n",0x32);
  }
  else {
    if (local_1e0 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Option -o <filename> is missing. Output file name is set to \'output.jpg\'\n",0x49
                );
      std::__cxx11::string::_M_replace((ulong)&local_1e8,0,local_1e0,0x1094ab);
    }
    cv::imread((string *)&local_270,(int)&local_210);
    cv::Mat::operator=((Mat *)local_150,(Mat *)&local_270);
    cv::Mat::~Mat((Mat *)&local_270);
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Input image","");
    cv::namedWindow((string *)&local_270,1);
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Input image","");
    local_168.sz.width = 0;
    local_168.sz.height = 0;
    local_168.flags = 0x1010000;
    local_168.obj = (Mat *)local_150;
    cv::imshow((string *)&local_270,&local_168);
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Image ",6);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_210,(long)local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," consists of ",0xd);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,((uint)local_150[0].super__InputArray.flags >> 3 & 0x1ff) + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," channels and ",0xe);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_150[0].super__InputArray.obj._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_150[0].super__InputArray.obj);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," pixels.\n",9);
    local_260[0] = 0;
    local_270 = (long *)CONCAT44(local_270._4_4_,0x2010000);
    local_268 = (Mat *)local_f0;
    cv::Mat::copyTo(local_150);
    lVar17 = (long)local_150[0].super__InputArray.obj._4_4_;
    local_1f0 = (long)(int)local_150[0].super__InputArray.obj;
    uVar15 = 0xffffffffffffffff;
    if (-1 < local_1f0) {
      uVar15 = local_1f0 * 8;
    }
    r = (uchar **)operator_new__(uVar15);
    g = (uchar **)operator_new__(uVar15);
    b = (uchar **)operator_new__(uVar15);
    uVar15 = (ulong)(local_150[0].super__InputArray.obj._4_4_ * (int)local_1f0);
    pvVar9 = operator_new__(uVar15);
    pvVar10 = operator_new__(uVar15);
    pvVar11 = operator_new__(uVar15);
    auVar4 = _DAT_001093e0;
    iVar16 = (int)local_1f0;
    if (0 < iVar16) {
      lVar1 = local_1f0 + -1;
      auVar19._8_4_ = (int)lVar1;
      auVar19._0_8_ = lVar1;
      auVar19._12_4_ = (int)((ulong)lVar1 >> 0x20);
      lVar1 = lVar17 * 2;
      lVar14 = 0;
      auVar19 = auVar19 ^ _DAT_001093e0;
      auVar26 = _DAT_001093d0;
      do {
        auVar25 = auVar26 ^ auVar4;
        iVar18 = auVar19._0_4_;
        iVar20 = auVar19._4_4_;
        iVar21 = auVar19._8_4_;
        iVar22 = auVar19._12_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && iVar18 < auVar25._0_4_ || iVar20 < auVar25._4_4_) &
                  1)) {
          *(void **)((long)r + lVar14) = pvVar9;
        }
        if ((auVar25._12_4_ != iVar22 || auVar25._8_4_ <= iVar21) && auVar25._12_4_ <= iVar22) {
          *(long *)((long)r + lVar14 + 8) = (long)pvVar9 + lVar17;
        }
        lVar24 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 2;
        auVar26._8_8_ = lVar24 + 2;
        lVar14 = lVar14 + 0x10;
        pvVar9 = (void *)((long)pvVar9 + lVar1);
      } while ((local_1f0 + 1U >> 1 & 0x7fffffff) << 4 != lVar14);
      if (0 < iVar16) {
        lVar14 = 0;
        auVar25 = _DAT_001093d0;
        do {
          auVar26 = auVar25 ^ auVar4;
          if ((bool)(~(auVar26._4_4_ == iVar20 && iVar18 < auVar26._0_4_ || iVar20 < auVar26._4_4_)
                    & 1)) {
            *(void **)((long)g + lVar14) = pvVar10;
          }
          if ((auVar26._12_4_ != iVar22 || auVar26._8_4_ <= iVar21) && auVar26._12_4_ <= iVar22) {
            *(long *)((long)g + lVar14 + 8) = (long)pvVar10 + lVar17;
          }
          lVar24 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 2;
          auVar25._8_8_ = lVar24 + 2;
          lVar14 = lVar14 + 0x10;
          pvVar10 = (void *)((long)pvVar10 + lVar1);
        } while ((local_1f0 + 1U >> 1 & 0x7fffffff) << 4 != lVar14);
        if (0 < iVar16) {
          lVar14 = 0;
          auVar23 = _DAT_001093d0;
          do {
            auVar26 = auVar23 ^ auVar4;
            if ((bool)(~(auVar26._4_4_ == iVar20 && iVar18 < auVar26._0_4_ || iVar20 < auVar26._4_4_
                        ) & 1)) {
              *(void **)((long)b + lVar14) = pvVar11;
            }
            if ((auVar26._12_4_ != iVar22 || auVar26._8_4_ <= iVar21) && auVar26._12_4_ <= iVar22) {
              *(long *)((long)b + lVar14 + 8) = (long)pvVar11 + lVar17;
            }
            lVar24 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 2;
            auVar23._8_8_ = lVar24 + 2;
            lVar14 = lVar14 + 0x10;
            pvVar11 = (void *)((long)pvVar11 + lVar1);
          } while ((ulong)(iVar16 + 1U >> 1) << 4 != lVar14);
        }
      }
    }
    fromMat2RGB((Mat *)local_150,r,g,b);
    pGVar12 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
    GSFloodFill<unsigned_char>::GSFloodFill
              (pGVar12,r,iVar16,local_150[0].super__InputArray.obj._4_4_);
    pGVar12->verbose = local_280;
    BVar7 = GSFloodFill<unsigned_char>::Transform(pGVar12);
    if (BVar7) {
      GSFloodFill<unsigned_char>::~GSFloodFill(pGVar12);
      operator_delete(pGVar12,0xa0);
      pGVar12 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
      GSFloodFill<unsigned_char>::GSFloodFill
                (pGVar12,g,iVar16,local_150[0].super__InputArray.obj._4_4_);
      pGVar12->verbose = local_280;
      BVar7 = GSFloodFill<unsigned_char>::Transform(pGVar12);
      if (BVar7) {
        GSFloodFill<unsigned_char>::~GSFloodFill(pGVar12);
        operator_delete(pGVar12,0xa0);
        pGVar12 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
        GSFloodFill<unsigned_char>::GSFloodFill
                  (pGVar12,b,iVar16,local_150[0].super__InputArray.obj._4_4_);
        pGVar12->verbose = local_280;
        BVar7 = GSFloodFill<unsigned_char>::Transform(pGVar12);
        if (BVar7) {
          GSFloodFill<unsigned_char>::~GSFloodFill(pGVar12);
          operator_delete(pGVar12,0xa0);
          fromRGB2Mat((Mat *)local_f0,r,g,b);
          local_270 = local_260;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"Flood-filled image","");
          cv::namedWindow((string *)&local_270,1);
          if (local_270 != local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
          local_270 = local_260;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"Flood-filled image","");
          local_168.sz.width = 0;
          local_168.sz.height = 0;
          local_168.flags = 0x1010000;
          local_168.obj = (Mat *)local_f0;
          cv::imshow((string *)&local_270,&local_168);
          if (local_270 != local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
          local_270 = local_260;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"FloodFilled.jpg","")
          ;
          local_168.sz.width = 0;
          local_168.sz.height = 0;
          local_168.flags = 0x1010000;
          local_178 = 0;
          local_188 = (undefined1  [16])0x0;
          local_168.obj = (Mat *)local_f0;
          cv::imwrite((string *)&local_270,&local_168,(vector *)local_188);
          if ((void *)local_188._0_8_ != (void *)0x0) {
            operator_delete((void *)local_188._0_8_,local_178 - local_188._0_8_);
          }
          if (local_270 != local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
          if (local_1c0 != (char *)0x0) {
            local_260[0] = 0;
            local_270 = (long *)CONCAT44(local_270._4_4_,0x2010000);
            local_268 = local_90;
            cv::Mat::copyTo(local_f0);
            BVar7 = diffMat(local_90,(Mat *)local_150);
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
            }
            cv::Mat::~Mat(local_90);
            cv::Mat::~Mat((Mat *)local_f0);
            cv::Mat::~Mat((Mat *)local_150);
            if (local_1c8 != &local_1b8) {
              operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
            }
            if (local_1e8 != &local_1d8) {
              operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
            }
            if (local_210 != &local_200) {
              operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
            }
            _Unwind_Resume(BVar7);
          }
          iVar16 = 0;
          cv::waitKey(0);
          goto LAB_001069b1;
        }
        pcVar13 = "floodFill.Transform (b) has failed! Aborting...\n";
      }
      else {
        pcVar13 = "floodFill.Transform (g) has failed! Aborting...\n";
      }
    }
    else {
      pcVar13 = "floodFill.Transform (r) has failed! Aborting...\n";
    }
    iVar16 = -1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,0x30);
  }
LAB_001069b1:
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_150);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
  }
  return iVar16;
}

Assistant:

int main(int argc, char *argv[])
{
	int i, j;
	string iFileName;
	string oFileName;
	string dFileName;
	Mat src, dst, diff;
	string XSDPath;
	int rows, cols;
	Boolean error;
	int verbose;

	verbose=0;
	// manage command-line args
	if (argc>1)
	for (i=1; i<argc; i++)
		if (argv[i][0] == '-')
		switch(argv[i][1]) {
		case 'v': verbose=1; break;
		case 'h': printHelp(); return 0;
		case 'i': iFileName = argv[++i]; break;
		case 'o': oFileName = argv[++i]; break;
		case 'd': dFileName = argv[++i]; break;
		case 'x': XSDPath = argv[++i]; break;

		default: std::cerr << "Unknown switch.\n" << std::endl;
				 printHelp();
				 return -1;
		}



	if (iFileName.empty()) {
		std::cerr << "Option -i <filename> must be present! Aborting...\n";
		return -1;
	}
	if (oFileName.empty()) {
		std::cerr << "Option -o <filename> is missing. Output file name is set to 'output.jpg'\n";
		oFileName = "output.jpg";
	}

	src = imread(iFileName, cv::IMREAD_COLOR);
	namedWindow("Input image", CV_WINDOW_AUTOSIZE );
	imshow("Input image", src );

	std::cout << "Image " << iFileName << " consists of " << src.channels() << " channels and "
		<< src.cols << "x" << src.rows << " pixels.\n";

	//dst = imread(iFileName, CV_LOAD_IMAGE_COLOR); //src.clone();
	src.copyTo(dst);

	cols = src.cols;
	rows = src.rows;

	unsigned char **r, **g, **b;
	unsigned char *buffr, *buffg, *buffb;

	r = new unsigned char *[rows];
	g = new unsigned char *[rows];
	b = new unsigned char *[rows];

	buffr = new unsigned char[ cols * rows ];
	buffg = new unsigned char[ cols * rows ];
	buffb = new unsigned char[ cols * rows ];

	for (int i=0, disp=0; i<rows; i++, disp += cols)
		r[i] = & buffr[disp];
	for (int i=0, disp=0; i<rows; i++, disp += cols)
		g[i] = & buffg[disp];
	for (int i=0, disp=0; i<rows; i++, disp += cols)
		b[i] = & buffb[disp];

	fromMat2RGB(src, r, g, b);

	/*
	unsigned char *origr, *origg, *origb;
	if (! dFileName.empty()) {
		origr = new unsigned char[ cols * rows ];
		origg = new unsigned char[ cols * rows ];
		origb = new unsigned char[ cols * rows ];
		int rxc = rows*cols;
		for (i=0; i<rxc; i++) {
			origr[i] = buffr[i];
			origg[i] = buffg[i];
			origb[i] = buffb[i];
		}
	}
	*/

	GSFloodFill<unsigned char> *floodFill;


	floodFill = new GSFloodFill<unsigned char>(r, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (r) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;

	floodFill = new GSFloodFill<unsigned char>(g, rows, cols);
	//GSFloodFill<unsigned char> floodFill(g, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (g) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;

	floodFill = new GSFloodFill<unsigned char>(b, rows, cols);
	//GSFloodFill<unsigned char> floodFill(b, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (b) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;


	// Now r, g and b point to the flood-filled transformation of the three input bands

	// (r,g,b) => dst
	fromRGB2Mat(dst, r, g, b);

	namedWindow( "Flood-filled image", CV_WINDOW_AUTOSIZE );
	imshow("Flood-filled image", dst );

	imwrite("FloodFilled.jpg", dst );



	if (! dFileName.empty()) {
		dst.copyTo(diff);
		diffMat(diff, src);

		namedWindow( "Difference image", CV_WINDOW_AUTOSIZE );
		imshow("Difference image", diff );
		imwrite("Difference.jpg", diff );
	}

	waitKey(0);
	return 0;
}